

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_graph.c
# Opt level: O0

EcsComponent * ecs_component_from_id(ecs_world_t *world,ecs_entity_t e)

{
  byte local_2a;
  byte local_29;
  EcsComponent *local_28;
  EcsComponent *component;
  ecs_entity_t trait;
  ecs_entity_t e_local;
  ecs_world_t *world_local;
  
  component = (EcsComponent *)0x0;
  trait = e;
  if ((e & 0xff00000000000000) == 0xfa00000000000000) {
    trait = (e & 0xffffffffffffff) >> 0x20;
    component = (EcsComponent *)e;
  }
  local_28 = (EcsComponent *)ecs_get_w_entity(world,trait,1);
  if ((local_28 == (EcsComponent *)0x0) && (component != (EcsComponent *)0x0)) {
    trait = (ulong)component & 0xffffffff;
    local_28 = (EcsComponent *)ecs_get_w_entity(world,trait,1);
  }
  local_29 = 1;
  if (local_28 != (EcsComponent *)0x0) {
    local_29 = (trait & 0xff00000000000000) == 0xfd00000000000000 ^ 0xff;
  }
  _ecs_assert((_Bool)(local_29 & 1),0xc,(char *)0x0,"!component || !ECS_HAS_ROLE(e, CHILDOF)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
              ,0x18);
  if ((local_28 != (EcsComponent *)0x0) && ((trait & 0xff00000000000000) == 0xfd00000000000000)) {
    __assert_fail("!component || !((e & ((ecs_entity_t)0xFF << 56)) == (((uint64_t)1 << 63) | ((ecs_entity_t)0x7D << 56)))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                  ,0x18,"const EcsComponent *ecs_component_from_id(ecs_world_t *, ecs_entity_t)");
  }
  local_2a = 1;
  if (local_28 != (EcsComponent *)0x0) {
    local_2a = (trait & 0xff00000000000000) == 0xfe00000000000000 ^ 0xff;
  }
  _ecs_assert((_Bool)(local_2a & 1),0xc,(char *)0x0,"!component || !ECS_HAS_ROLE(e, INSTANCEOF)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
              ,0x19);
  if ((local_28 != (EcsComponent *)0x0) && ((trait & 0xff00000000000000) == 0xfe00000000000000)) {
    __assert_fail("!component || !((e & ((ecs_entity_t)0xFF << 56)) == (((uint64_t)1 << 63) | ((ecs_entity_t)0x7E << 56)))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/table_graph.c"
                  ,0x19,"const EcsComponent *ecs_component_from_id(ecs_world_t *, ecs_entity_t)");
  }
  return local_28;
}

Assistant:

const EcsComponent* ecs_component_from_id(
    ecs_world_t *world,
    ecs_entity_t e)
{
    ecs_entity_t trait = 0;

    /* If this is a trait, get the trait component from the identifier */
    if (ECS_HAS_ROLE(e, TRAIT)) {
        trait = e;
        e = e & ECS_COMPONENT_MASK;
        e = ecs_entity_t_hi(e);
    }

    const EcsComponent *component = ecs_get(world, e, EcsComponent);
    if (!component && trait) {
        /* If this is a trait column and the trait is not a component, use
         * the component type of the component the trait is applied to. */
        e = ecs_entity_t_lo(trait);
        component = ecs_get(world, e, EcsComponent);
    }

    ecs_assert(!component || !ECS_HAS_ROLE(e, CHILDOF), ECS_INTERNAL_ERROR, NULL);
    ecs_assert(!component || !ECS_HAS_ROLE(e, INSTANCEOF), ECS_INTERNAL_ERROR, NULL);

    return component;
}